

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O3

ssize_t knet_read(knetFile *fp,void *buf,size_t len)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int fd;
  off_t oVar4;
  
  fd = fp->fd;
  if (fd == -1) {
    return 0;
  }
  iVar1 = fp->type;
  if (iVar1 == 3) {
    if (fp->is_ready == 0) {
      khttp_connect_file(fp);
LAB_001134df:
      iVar1 = fp->type;
      goto LAB_001134e1;
    }
  }
  else if (iVar1 == 2) {
    if (fp->is_ready == 0) {
      if (fp->no_reconnect == 0) {
        kftp_reconnect(fp);
      }
      kftp_connect_file(fp);
      goto LAB_001134df;
    }
  }
  else {
LAB_001134e1:
    if (iVar1 == 1) {
      oVar4 = 0;
      if (len != 0) {
        do {
          while( true ) {
            sVar2 = read(fp->fd,(void *)((long)buf + oVar4),len);
            if (-1 < sVar2) break;
            piVar3 = __errno_location();
            if (*piVar3 != 4) {
              return -1;
            }
          }
          if (sVar2 == 0) break;
          oVar4 = oVar4 + sVar2;
          len = len - sVar2;
        } while (len != 0);
      }
      goto LAB_0011352e;
    }
    fd = fp->fd;
  }
  oVar4 = my_netread(fd,buf,len);
LAB_0011352e:
  fp->offset = fp->offset + oVar4;
  return oVar4;
}

Assistant:

ssize_t knet_read(knetFile *fp, void *buf, size_t len)
{
	off_t l = 0;
	if (fp->fd == -1) return 0;
	if (fp->type == KNF_TYPE_FTP) {
		if (fp->is_ready == 0) {
			if (!fp->no_reconnect) kftp_reconnect(fp);
			kftp_connect_file(fp);
		}
	} else if (fp->type == KNF_TYPE_HTTP) {
		if (fp->is_ready == 0)
			khttp_connect_file(fp);
	}
	if (fp->type == KNF_TYPE_LOCAL) { // on Windows, the following block is necessary; not on UNIX
		size_t rest = len;
		ssize_t curr;
		while (rest) {
			do {
				curr = read(fp->fd, (void*)((char*)buf + l), rest);
			} while (curr < 0 && EINTR == errno);
			if (curr < 0) return -1;
			if (curr == 0) break;
			l += curr; rest -= curr;
		}
	} else l = my_netread(fp->fd, buf, len);
	fp->offset += l;
	return l;
}